

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O3

ModelPtr createModelWithComponent(string *modelName,string *componentName)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  ComponentPtr CVar2;
  ModelPtr MVar3;
  ModelPtr MStack_28;
  
  libcellml::Model::create();
  libcellml::NamedEntity::setName((string *)(modelName->_M_dataplus)._M_p);
  CVar2 = createComponentInModel(&MStack_28,modelName);
  _Var1 = CVar2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi;
  if (MStack_28.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (MStack_28.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX;
  }
  MVar3.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  MVar3.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)modelName;
  return (ModelPtr)MVar3.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

libcellml::ModelPtr createModelWithComponent(const std::string &modelName, const std::string &componentName)
{
    libcellml::ModelPtr model = libcellml::Model::create();
    model->setName(modelName);
    createComponentInModel(model, componentName);
    return model;
}